

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntScalarType(ValidationState_t *this,uint32_t id)

{
  Instruction *pIVar1;
  bool bVar2;
  
  pIVar1 = FindDef(this,id);
  if ((pIVar1 == (Instruction *)0x0) || ((pIVar1->inst_).opcode != 0x15)) {
    bVar2 = false;
  }
  else {
    bVar2 = (pIVar1->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[3] == 0;
  }
  return bVar2;
}

Assistant:

bool ValidationState_t::IsUnsignedIntScalarType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  return inst && inst->opcode() == spv::Op::OpTypeInt && inst->word(3) == 0;
}